

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

lys_node_grp * lys_find_grouping_up(char *name,lys_node *start)

{
  lys_node *plVar1;
  lys_node_grp *plVar2;
  int iVar3;
  lys_module *plVar4;
  lys_node_grp *plVar5;
  lys_node_grp *plVar6;
  
  if (start != (lys_node *)0x0) {
    do {
      plVar1 = ((lys_node_grp *)start)->parent;
      if (((plVar1 != (lys_node *)0x0) && (plVar1->parent == (lys_node *)0x0)) &&
         (plVar1->nodetype == LYS_AUGMENT)) {
        plVar4 = plVar1->module;
        if ((plVar4->field_0x40 & 1) != 0) {
          plVar4 = (lys_module *)plVar4->data;
        }
        start = plVar4->data;
        if ((lys_node_grp *)start == (lys_node_grp *)0x0) {
          return (lys_node_grp *)0x0;
        }
      }
      if (((lys_node_grp *)start)->nodetype == LYS_EXT) {
        plVar4 = ((lys_node_grp *)start)->module;
        if ((plVar4->field_0x40 & 1) != 0) {
          plVar4 = (lys_module *)plVar4->data;
        }
        start = plVar4->data;
        if ((lys_node_grp *)start == (lys_node_grp *)0x0) {
          return (lys_node_grp *)0x0;
        }
LAB_0015a768:
        plVar5 = (lys_node_grp *)0x0;
        plVar6 = (lys_node_grp *)start;
        do {
          plVar2 = (lys_node_grp *)start;
          if ((plVar5 != (lys_node_grp *)0x0) && (plVar2 = plVar5, plVar6 == plVar5)) break;
          plVar5 = plVar2;
          if ((plVar6->nodetype == LYS_GROUPING) && (iVar3 = strcmp(name,plVar6->name), iVar3 == 0))
          {
            return plVar6;
          }
          plVar6 = (lys_node_grp *)plVar6->prev;
        } while (plVar6 != (lys_node_grp *)0x0);
      }
      else if ((((lys_node_grp *)start)->parent == (lys_node *)0x0) ||
              ((((lys_node_grp *)start)->parent->nodetype &
               (LYS_AUGMENT|LYS_USES|LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN)) goto LAB_0015a768;
      start = ((lys_node_grp *)start)->parent;
    } while ((lys_node_grp *)start != (lys_node_grp *)0x0);
  }
  return (lys_node_grp *)0x0;
}

Assistant:

struct lys_node_grp *
lys_find_grouping_up(const char *name, struct lys_node *start)
{
    struct lys_node *par_iter, *iter, *stop;

    for (par_iter = start; par_iter; par_iter = par_iter->parent) {
        /* top-level augment, look into module (uses augment is handled correctly below) */
        if (par_iter->parent && !par_iter->parent->parent && (par_iter->parent->nodetype == LYS_AUGMENT)) {
            par_iter = lys_main_module(par_iter->parent->module)->data;
            if (!par_iter) {
                break;
            }
        }

        if (par_iter->nodetype == LYS_EXT) {
            /* we are in a top-level extension, search grouping in top-level groupings */
            par_iter = lys_main_module(par_iter->module)->data;
            if (!par_iter) {
                /* not connected yet, wait */
                return NULL;
            }
        } else if (par_iter->parent && (par_iter->parent->nodetype & (LYS_CHOICE | LYS_CASE | LYS_AUGMENT | LYS_USES))) {
            continue;
        }

        for (iter = par_iter, stop = NULL; iter; iter = iter->prev) {
            if (!stop) {
                stop = par_iter;
            } else if (iter == stop) {
                break;
            }
            if (iter->nodetype != LYS_GROUPING) {
                continue;
            }

            if (!strcmp(name, iter->name)) {
                return (struct lys_node_grp *)iter;
            }
        }
    }

    return NULL;
}